

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O0

Vector<float,_2> __thiscall
tcu::select<float,2>
          (tcu *this,Vector<float,_2> *trueVal,Vector<float,_2> *falseVal,Vector<bool,_2> *cond)

{
  Vector<float,_2> VVar1;
  bool *pbVar2;
  float *pfVar3;
  float extraout_XMM0_Da;
  float extraout_XMM0_Db;
  float fVar4;
  undefined4 local_44;
  undefined4 local_2c;
  int i;
  Vector<bool,_2> *cond_local;
  Vector<float,_2> *falseVal_local;
  Vector<float,_2> *trueVal_local;
  Vector<float,_2> *res;
  
  Vector<float,_2>::Vector((Vector<float,_2> *)this);
  local_44 = extraout_XMM0_Da;
  fVar4 = extraout_XMM0_Db;
  for (local_2c = 0; local_2c < 2; local_2c = local_2c + 1) {
    pbVar2 = Vector<bool,_2>::operator[](cond,local_2c);
    if ((*pbVar2 & 1U) == 0) {
      pfVar3 = Vector<float,_2>::operator[](falseVal,local_2c);
      local_44 = *pfVar3;
    }
    else {
      pfVar3 = Vector<float,_2>::operator[](trueVal,local_2c);
      local_44 = *pfVar3;
    }
    pfVar3 = Vector<float,_2>::operator[]((Vector<float,_2> *)this,local_2c);
    fVar4 = 0.0;
    *pfVar3 = local_44;
  }
  VVar1.m_data[1] = fVar4;
  VVar1.m_data[0] = local_44;
  return (Vector<float,_2>)VVar1.m_data;
}

Assistant:

inline Vector<T, Size> select (const Vector<T, Size>& trueVal, const Vector<T, Size>& falseVal, const Vector<bool, Size>& cond)
{
	Vector<T, Size> res;
	for (int i = 0; i < Size; i++)
		res[i] = cond[i] ? trueVal[i] : falseVal[i];
	return res;
}